

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_mem.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  allocator<char> local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  vector<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_> ranges;
  elfio elffile;
  ifstream proc_maps;
  byte abStack_200 [488];
  
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_308,"/proc/",(allocator<char> *)&local_2e8);
    std::operator+(&local_328,&local_308,argv[1]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elffile,
                   &local_328,"/maps");
    std::ifstream::ifstream(&proc_maps,(string *)&elffile,_S_in);
    std::__cxx11::string::~string((string *)&elffile);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    if ((abStack_200[*(long *)(_proc_maps + -0x18)] & 5) == 0) {
      ranges.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ranges.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ranges.
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&elffile,argv[2],(allocator<char> *)&local_328);
      get_translation_ranges(&proc_maps,(string *)&elffile,&ranges);
      std::__cxx11::string::~string((string *)&elffile);
      ELFIO::elfio::elfio(&elffile);
      ELFIO::address_translator::set_address_translation(&elffile.addr_translator,&ranges);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"/proc/",&local_329);
      std::operator+(&local_308,&local_2e8,argv[1]);
      std::operator+(&local_328,&local_308,"/mem");
      bVar1 = ELFIO::elfio::load(&elffile,&local_328,true);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_2e8);
      if (bVar1) {
        ELFIO::dump::header((ostream *)&std::cout,&elffile);
        ELFIO::dump::segment_headers((ostream *)&std::cout,&elffile);
        ELFIO::dump::segment_datas((ostream *)&std::cout,&elffile);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open ");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"/proc/",&local_329)
        ;
        std::operator+(&local_308,&local_2e8,argv[1]);
        std::operator+(&local_328,&local_308,"/mem");
        poVar2 = std::operator<<(poVar2,(string *)&local_328);
        poVar2 = std::operator<<(poVar2," file");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_2e8);
      }
      ELFIO::elfio::~elfio(&elffile);
      std::_Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>::
      ~_Vector_base(&ranges.
                     super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                   );
      iVar3 = 0;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open ");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_308,"/proc/",(allocator<char> *)&local_2e8);
      std::operator+(&local_328,&local_308,argv[1]);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elffile,
                     &local_328,"/maps");
      poVar2 = std::operator<<(poVar2,(string *)&elffile);
      poVar2 = std::operator<<(poVar2," file");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&elffile);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_308);
      iVar3 = 2;
    }
    std::ifstream::~ifstream(&proc_maps);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: proc_mem <pid> <full_file_path>");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main( int argc, char** argv )
{
    if ( argc != 3 ) {
        std::cout << "Usage: proc_mem <pid> <full_file_path>" << std::endl;
        return 1;
    }

    // Process file translation regions for the ELF file from /proc/pid/maps
    std::ifstream proc_maps( std::string( "/proc/" ) + argv[1] + "/maps" );
    if ( !proc_maps ) {
        std::cout << "Can't open "
                  << std::string( "/proc/" ) + argv[1] + "/maps" << " file"
                  << std::endl;
        return 2;
    }

    // Retrieve memory address translation ranges
    std::vector<address_translation> ranges;
    get_translation_ranges( proc_maps, argv[2], ranges );

    // Set address translation ranges prior loading ELF file
    elfio elffile;
    elffile.set_address_translation( ranges );

    // The 'load' will use the provided address translation now
    if ( elffile.load( std::string( "/proc/" ) + argv[1] + "/mem", true ) ) {
        dump::header( std::cout, elffile );
        dump::segment_headers( std::cout, elffile );
        dump::segment_datas( std::cout, elffile );
    }
    else {
        std::cout << "Can't open " << std::string( "/proc/" ) + argv[1] + "/mem"
                  << " file" << std::endl;
    }

    return 0;
}